

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintVersion(cmDocumentation *this,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  
  if ((this->NameString)._M_string_length == 0) {
    pcVar2 = "CMake";
  }
  else {
    pcVar2 = (this->NameString)._M_dataplus._M_p;
  }
  poVar1 = std::operator<<(os,pcVar2);
  poVar1 = std::operator<<(poVar1," version ");
  pcVar2 = cmVersion::GetCMakeVersion();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,
                  "\n\nCMake suite maintained and supported by Kitware (kitware.com/cmake).\n");
  return true;
}

Assistant:

bool cmDocumentation::PrintVersion(std::ostream& os)
{
  os <<
    this->GetNameString() <<
    " version " << cmVersion::GetCMakeVersion() << "\n"
    "\n"
    "CMake suite maintained and supported by Kitware (kitware.com/cmake).\n"
    ;
  return true;
}